

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O2

Var Js::TaggedInt::Increment(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  Var pvVar5;
  
  pvVar5 = (Var)((ulong)aValue & 0xffffffff00000000 | (ulong)((int)aValue + 1));
  if (pvVar5 == (Var)0x1000080000000) {
    pvVar5 = IncrementOverflowHelper((ScriptContext *)aValue);
    return pvVar5;
  }
  iVar3 = ToInt32(aValue);
  if ((Var)((ulong)(iVar3 + 1) | 0x1000000000000) != pvVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                ,0x242,"(result == ToVarUnchecked( ToInt32(aValue) + 1 ))",
                                "Logic error in Int31::Increment");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return pvVar5;
}

Assistant:

Var TaggedInt::Increment(Var aValue, ScriptContext* scriptContext)
    {
#if _M_IX86


        __asm
        {
            mov     eax, aValue
            add     eax, 2
            jno     LblDone
            push    scriptContext
            call    TaggedInt::IncrementOverflowHelper
        LblDone:
            ; result is in eax
        }
#else

#if INT32VAR
        Var result = aValue;
        (*(unsigned int *)&result)++;  // unsigned to avoid signed int overflow
#else
        unsigned int n = reinterpret_cast<unsigned int>(aValue);
        n += 2;
        Var result = reinterpret_cast<Var>(n);
#endif

        // Wrap-around
        if( result == MinVal() )
        {
            // Use New instead of ToVar for this constant
            return IncrementOverflowHelper(scriptContext);
        }

        AssertMsg( result == ToVarUnchecked( ToInt32(aValue) + 1 ), "Logic error in Int31::Increment" );
        return result;
#endif
    }